

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpki-rov.c
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  size_t sStackY_340;
  uint reason_len;
  pfx_record *reason;
  pfxv_state result;
  int asn;
  int mask;
  rtr_mgr_config *conf;
  rtr_socket rtr_tcp;
  char *local_288;
  char *pcStack_280;
  undefined8 local_278;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined8 uStack_264;
  tr_socket tr_tcp;
  char tmp [100];
  char ip [46];
  lrtr_ip_addr pref;
  char input [256];
  rtr_mgr_group groups [1];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc < 3) {
    printf("Usage: %s [host] [port]\n",*argv);
  }
  else {
    local_288 = argv[1];
    pcStack_280 = argv[2];
    local_278 = 0;
    uStack_270 = 0;
    uStack_26c = 0;
    uStack_268 = 0;
    uStack_264 = 0;
    tr_tcp_init(&local_288,&tr_tcp);
    rtr_tcp.tr_socket = &tr_tcp;
    groups[0].sockets = (rtr_socket **)malloc(8);
    groups[0].sockets_len = 1;
    *groups[0].sockets = &rtr_tcp;
    groups[0].preference = '\x01';
    iVar3 = rtr_mgr_init(&conf,groups,1,connection_status_callback,0);
    if (-1 < iVar3) {
      iVar3 = rtr_mgr_add_roa_support(conf,0);
      if (iVar3 == -1) {
        fwrite("Failed initializing ROA support\n",0x20,1,_stderr);
      }
      iVar3 = rtr_mgr_add_aspa_support(conf,0);
      if (iVar3 == -1) {
        fwrite("Failed initializing ASPA support\n",0x21,1,_stderr);
      }
      iVar3 = rtr_mgr_add_spki_support(conf,0);
      if (iVar3 == -1) {
        fwrite("Failed initializing BGPSEC support\n",0x23,1,_stderr);
      }
      rtr_mgr_setup_sockets(conf,groups,1,0x32,600,600);
      rtr_mgr_start(conf);
      iVar3 = 0x14;
      do {
        cVar2 = rtr_mgr_conf_in_sync(conf);
        if (cVar2 != '\0') goto LAB_00101466;
        iVar4 = connection_error(connection_status);
        if (iVar4 != 0) goto LAB_00101791;
        sleep(1);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      fgets(input,0x100,_stdin);
      puts("timeout");
      fflush(_stdout);
    }
  }
LAB_00101791:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return 1;
LAB_00101466:
  iVar3 = connection_error(connection_status);
  if (iVar3 != 0) goto LAB_00101791;
  pcVar7 = fgets(input,0x100,_stdin);
  if (pcVar7 == (char *)0x0) {
    puts("input error");
    goto LAB_00101791;
  }
  sVar8 = strlen(input);
  uVar5 = (int)sVar8 - 1;
  if (input[(int)uVar5] == '\n') {
    input[(int)uVar5] = '\0';
  }
  uVar12 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar12 = 0;
  }
  iVar3 = 0;
  uVar9 = 0;
  while (uVar11 = uVar9, uVar9 = uVar11 + 1, uVar9 - uVar12 != 1) {
    if ((input[uVar11] == ' ') && (input[uVar11 + 1] != ' ')) {
      iVar3 = iVar3 + (uint)(uVar9 != 1 && input[uVar11 + 1] != '\0');
    }
  }
  if (iVar3 == 2) {
    pcVar7 = strtok(input," ");
    sVar8 = strlen(pcVar7);
    if (sVar8 < 0x2e) {
      ip[0x20] = '\0';
      ip[0x21] = '\0';
      ip[0x22] = '\0';
      ip[0x23] = '\0';
      ip[0x24] = '\0';
      ip[0x25] = '\0';
      ip[0x26] = '\0';
      ip[0x27] = '\0';
      ip[0x28] = '\0';
      ip[0x29] = '\0';
      ip[0x2a] = '\0';
      ip[0x2b] = '\0';
      ip[0x2c] = '\0';
      ip[0x2d] = '\0';
      ip[0x10] = '\0';
      ip[0x11] = '\0';
      ip[0x12] = '\0';
      ip[0x13] = '\0';
      ip[0x14] = '\0';
      ip[0x15] = '\0';
      ip[0x16] = '\0';
      ip[0x17] = '\0';
      ip[0x18] = '\0';
      ip[0x19] = '\0';
      ip[0x1a] = '\0';
      ip[0x1b] = '\0';
      ip[0x1c] = '\0';
      ip[0x1d] = '\0';
      ip[0x1e] = '\0';
      ip[0x1f] = '\0';
      ip[0] = '\0';
      ip[1] = '\0';
      ip[2] = '\0';
      ip[3] = '\0';
      ip[4] = '\0';
      ip[5] = '\0';
      ip[6] = '\0';
      ip[7] = '\0';
      ip[8] = '\0';
      ip[9] = '\0';
      ip[10] = '\0';
      ip[0xb] = '\0';
      ip[0xc] = '\0';
      ip[0xd] = '\0';
      ip[0xe] = '\0';
      ip[0xf] = '\0';
      strncpy(ip,pcVar7,0x2d);
      iVar3 = lrtr_ip_str_to_addr(ip,&pref);
      if (iVar3 == 0) {
        pcVar7 = strtok((char *)0x0," ");
        iVar3 = str_to_int(pcVar7,&mask);
        if (iVar3 == 0) {
          pcVar7 = strtok((char *)0x0," ");
          iVar6 = str_to_int(pcVar7,&asn);
          iVar4 = mask;
          iVar3 = asn;
          if (iVar6 == 0) {
            reason = (pfx_record *)0x0;
            reason_len = 0;
            pfx_table_validate_r
                      ((*groups[0].sockets)->pfx_table,&reason,&reason_len,asn,&pref,mask & 0xff,
                       &result);
            uVar12 = (ulong)result;
            if (BGP_PFXV_STATE_INVALID < result) {
              uVar12 = 0xffffffff;
            }
            printf("%s %d %d|",ip,(ulong)(uint)iVar4,(ulong)(uint)iVar3);
            uVar9 = (ulong)reason_len;
            if (reason_len != 0 && reason != (pfx_record *)0x0) {
              lVar10 = 0x19;
              uVar11 = 0;
              while (uVar11 < uVar9) {
                lrtr_ip_addr_to_str((long)reason + lVar10 + -0x15,tmp,100);
                printf("%u %s %u %u",(ulong)*(uint *)((long)reason + lVar10 + -0x19),tmp,
                       (ulong)*(byte *)((long)reason + lVar10 + -1),
                       (ulong)*(byte *)((long)&reason->asn + lVar10));
                uVar11 = uVar11 + 1;
                uVar9 = (ulong)reason_len;
                if (uVar11 < uVar9) {
                  putchar(0x2c);
                  uVar9 = (ulong)reason_len;
                }
                lVar10 = lVar10 + 0x28;
              }
            }
            printf("|%d",uVar12);
            putchar(10);
            fflush(_stdout);
            goto LAB_00101466;
          }
          pcVar7 = "Error: Invalid asn\n";
          sStackY_340 = 0x13;
        }
        else {
          pcVar7 = "Error: Invalid mask\n";
          sStackY_340 = 0x14;
        }
        fwrite(pcVar7,sStackY_340,1,_stderr);
        goto LAB_00101466;
      }
    }
    fwrite("Error: Invalid ip addr\n",0x17,1,_stderr);
    goto LAB_00101466;
  }
  puts("Arguments required: IP Mask ASN");
  fflush(_stdout);
  goto LAB_00101466;
}

Assistant:

int main(int argc, char *argv[])
{
	/* check arguments, need hostname/IP and port of cache-server */
	if (argc < 3) {
		printf("Usage: %s [host] [port]\n", argv[0]);
		return EXIT_FAILURE;
	}

	struct tr_socket tr_tcp;
	struct tr_tcp_config tcp_config = {argv[1], argv[2], NULL, NULL, NULL, 0};
	struct rtr_socket rtr_tcp;
	struct rtr_mgr_config *conf;
	struct rtr_mgr_group groups[1];

	/* init a TCP transport and create rtr socket */
	tr_tcp_init(&tcp_config, &tr_tcp);
	rtr_tcp.tr_socket = &tr_tcp;

	/* create a rtr_mgr_group array with 1 element */
	groups[0].sockets = malloc(1 * sizeof(struct rtr_socket *));
	groups[0].sockets_len = 1;
	groups[0].sockets[0] = &rtr_tcp;
	groups[0].preference = 1;

	if (rtr_mgr_init(&conf, groups, 1, &connection_status_callback, NULL) < 0)
		return EXIT_FAILURE;

	if (rtr_mgr_add_roa_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing ROA support\n");
	}

	if (rtr_mgr_add_aspa_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing ASPA support\n");
	}

	if (rtr_mgr_add_spki_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing BGPSEC support\n");
	}

	rtr_mgr_setup_sockets(conf, groups, 1, 50, 600, 600);

	rtr_mgr_start(conf);

	char input[256];
	int sleep_counter = 0;

	/* wait till at least one rtr_mgr_group is synchronized with server */
	while (!rtr_mgr_conf_in_sync(conf)) {
		if (connection_error(connection_status))
			return EXIT_FAILURE;

		sleep(1);
		sleep_counter++;
		if (sleep_counter >= connection_timeout) {
			/*
			 * Wait for input before printing "timeout",
			 * to avoid "broken pipee error while communicating
			 * with the Python program
			 */
			if (fgets(input, 256, stdin))
				;
			printf("timeout\n");
			fflush(stdout);
			return EXIT_FAILURE;
		}
	}

	int counter;
	/* loop for input */
	while (1) {
		int input_len;
		int spaces;

		/* recheck connection, exit on failure */
		if (connection_error(connection_status))
			return EXIT_FAILURE;

		/* try reading from stdin, exit on failure */
		if (!fgets(input, 256, stdin)) {
			printf("input error\n");
			return EXIT_FAILURE;
		}

		/* remove newline, if present */
		input_len = strlen(input) - 1;
		if (input[input_len] == '\n')
			input[input_len] = '\0';

		/* check if there are exactly 3 arguments */
		spaces = 0;
		for (counter = 0; counter < input_len; counter++) {
			if (input[counter] == ' ' && input[counter + 1] != ' ' && input[counter + 1] != '\0' &&
			    counter != 0)
				spaces++;
		}

		/* check input matching pattern */
		if (spaces != 2) {
			printf("Arguments required: IP Mask ASN\n");
			fflush(stdout);
			continue;
		}

		char delims[] = " ";
		char *input_tok = NULL;

		input_tok = strtok(input, delims);
		struct lrtr_ip_addr pref;
		char ip[INET6_ADDRSTRLEN];

		if (strlen(input_tok) > sizeof(ip) - 1) {
			fprintf(stderr, "Error: Invalid ip addr\n");
			continue;
		}

		memset(ip, 0, sizeof(ip));
		strncpy(ip, input_tok, sizeof(ip) - 1);

		if (lrtr_ip_str_to_addr(ip, &pref) != 0) {
			fprintf(stderr, "Error: Invalid ip addr\n");
			continue;
		}

		input_tok = strtok(NULL, delims);
		int mask;

		if (str_to_int(input_tok, &mask)) {
			fprintf(stderr, "Error: Invalid mask\n");
			continue;
		}

		input_tok = strtok(NULL, delims);
		int asn;

		if (str_to_int(input_tok, &asn)) {
			fprintf(stderr, "Error: Invalid asn\n");
			continue;
		}

		enum pfxv_state result;
		struct pfx_record *reason = NULL;
		unsigned int reason_len = 0;

		/* do validation */
		pfx_table_validate_r(groups[0].sockets[0]->pfx_table, &reason, &reason_len, asn, &pref, mask, &result);

		int validity_code = -1;
		/* translate validation result */
		if (result == BGP_PFXV_STATE_VALID)
			validity_code = 0;
		else if (result == BGP_PFXV_STATE_NOT_FOUND)
			validity_code = 1;
		else if (result == BGP_PFXV_STATE_INVALID)
			validity_code = 2;

		/* IP Mask BGP-ASN| */
		printf("%s %d %d|", ip, mask, asn);

		/* ROA-ASN IP MaskMin MaskMax, ... */
		if (reason && (reason_len > 0)) {
			unsigned int i;

			for (i = 0; i < reason_len; i++) {
				char tmp[100];

				lrtr_ip_addr_to_str(&reason[i].prefix, tmp, sizeof(tmp));
				printf("%u %s %u %u", reason[i].asn, tmp, reason[i].min_len, reason[i].max_len);
				if ((i + 1) < reason_len)
					printf(",");
			}
		}

		/* |validity_code */
		printf("|%d", validity_code);

		printf("\n");
		fflush(stdout);
	}

	rtr_mgr_stop(conf);
	rtr_mgr_free(conf);
	free(groups[0].sockets);

	return EXIT_SUCCESS;
}